

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O1

void __thiscall
p2t::Sweep::FillRightAboveEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  Point *pPVar3;
  Point *pPVar4;
  double dVar5;
  double dVar6;
  
  pNVar1 = node->next;
  pPVar3 = pNVar1->point;
  dVar6 = pPVar3->x;
  pPVar4 = edge->p;
  dVar5 = pPVar4->x;
  if (dVar6 < dVar5) {
    do {
      dVar6 = (pPVar3->y - pPVar4->y) * (edge->q->x - dVar5) -
              (dVar6 - dVar5) * (edge->q->y - pPVar4->y);
      pNVar2 = pNVar1;
      if ((1e-12 <= ABS(dVar6)) && (0.0 < dVar6)) {
        FillRightBelowEdgeEvent(this,tcx,edge,node);
        pNVar2 = node;
      }
      pNVar1 = pNVar2->next;
      pPVar3 = pNVar1->point;
      dVar6 = pPVar3->x;
      pPVar4 = edge->p;
      dVar5 = pPVar4->x;
      node = pNVar2;
    } while (dVar6 < dVar5);
  }
  return;
}

Assistant:

void Sweep::FillRightAboveEdgeEvent(SweepContext& tcx, Edge* edge, Node* node)
{
  while (node->next->point->x < edge->p->x) {
    // Check if next node is below the edge
    if (Orient2d(*edge->q, *node->next->point, *edge->p) == CCW) {
      FillRightBelowEdgeEvent(tcx, edge, *node);
    } else {
      node = node->next;
    }
  }
}